

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  curl_slist *hdr_00;
  char *pcVar1;
  size_t numbytes;
  mimestate tok;
  curl_slist *local_80;
  curl_slist *hdr;
  size_t sz;
  size_t cursize;
  _Bool *hasread_local;
  size_t bufsize_local;
  char *buffer_local;
  curl_mimepart *part_local;
  
  sz = 0;
  hasread_local = (_Bool *)bufsize;
  bufsize_local = (size_t)buffer;
  do {
    if (hasread_local == (_Bool *)0x0) {
      return sz;
    }
    hdr = (curl_slist *)0x0;
    hdr_00 = (curl_slist *)(part->state).ptr;
    switch((part->state).state) {
    case MIMESTATE_BEGIN:
      tok = MIMESTATE_CURLHEADERS;
      if ((part->flags & 2) != 0) {
        tok = MIMESTATE_BODY;
      }
      mimesetstate(&part->state,tok,part->curlheaders);
      break;
    case MIMESTATE_CURLHEADERS:
switchD_001603fc_caseD_1:
      if (hdr_00 == (curl_slist *)0x0) {
        mimesetstate(&part->state,MIMESTATE_USERHEADERS,part->userheaders);
      }
      else {
        pcVar1 = hdr_00->data;
        numbytes = strlen(hdr_00->data);
        hdr = (curl_slist *)
              readback_bytes(&part->state,(char *)bufsize_local,(size_t)hasread_local,pcVar1,
                             numbytes,"\r\n",2);
        if (hdr == (curl_slist *)0x0) {
          mimesetstate(&part->state,(part->state).state,hdr_00->next);
        }
      }
      break;
    case MIMESTATE_USERHEADERS:
      if (hdr_00 == (curl_slist *)0x0) {
        mimesetstate(&part->state,MIMESTATE_EOH,(void *)0x0);
      }
      else {
        pcVar1 = match_header(hdr_00,"Content-Type",0xc);
        if (pcVar1 == (char *)0x0) goto switchD_001603fc_caseD_1;
        mimesetstate(&part->state,MIMESTATE_USERHEADERS,hdr_00->next);
      }
      break;
    case MIMESTATE_EOH:
      hdr = (curl_slist *)
            readback_bytes(&part->state,(char *)bufsize_local,(size_t)hasread_local,"\r\n",2,"",0);
      if (hdr == (curl_slist *)0x0) {
        mimesetstate(&part->state,MIMESTATE_BODY,(void *)0x0);
      }
      break;
    case MIMESTATE_BODY:
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state,MIMESTATE_CONTENT,(void *)0x0);
      break;
    default:
      break;
    case MIMESTATE_CONTENT:
      if (part->encoder == (mime_encoder *)0x0) {
        hdr = (curl_slist *)
              read_part_content(part,(char *)bufsize_local,(size_t)hasread_local,hasread);
      }
      else {
        hdr = (curl_slist *)
              read_encoded_part_content(part,(char *)bufsize_local,(size_t)hasread_local,hasread);
      }
      if ((undefined1 *)((long)&hdr->data + 2U) < (undefined1 *)0x2) {
LAB_0016067b:
        if (sz == 0) {
          local_80 = hdr;
        }
        else {
          local_80 = (curl_slist *)sz;
        }
        return (size_t)local_80;
      }
      if (hdr == (curl_slist *)0x0) {
        mimesetstate(&part->state,MIMESTATE_END,(void *)0x0);
        if ((part->kind == MIMEKIND_FILE) && (part->fp != (FILE *)0x0)) {
          fclose((FILE *)part->fp);
          part->fp = (FILE *)0x0;
        }
        goto LAB_0016067b;
      }
      if (hdr + -0x1000000 < (curl_slist *)0x2) goto LAB_0016067b;
      break;
    case MIMESTATE_END:
      return sz;
    }
    sz = (long)&hdr->data + sz;
    bufsize_local = (long)&hdr->data + bufsize_local;
    hasread_local = hasread_local + -(long)hdr;
  } while( true );
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize, bool *hasread)
{
  size_t cursize = 0;

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      FALLTHROUGH();
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), STRCONST("\r\n"));
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, STRCONST("\r\n"),
                          STRCONST(""));
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize, hasread);
      else
        sz = read_part_content(part, buffer, bufsize, hasread);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        FALLTHROUGH();
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
      case STOP_FILLING:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

  return cursize;
}